

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  OptionAdder *pOVar1;
  size_t sVar2;
  OptionValue *pOVar3;
  uint *puVar4;
  double *pdVar5;
  uchar *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ostream *poVar8;
  reference signal_00;
  ulong uVar9;
  exception *e_1;
  ofstream output_file;
  undefined1 local_b90 [8];
  vector<double,_std::allocator<double>_> signal;
  undefined1 local_b70 [4];
  uint32_t i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  signals;
  OptionParseException *e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b48;
  string local_b28;
  allocator<char> local_b01;
  string local_b00;
  allocator<char> local_ad9;
  string local_ad8;
  allocator<char> local_ab1;
  string local_ab0;
  allocator<char> local_a89;
  string local_a88;
  allocator<char> local_a61;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  allocator<char> local_9c1;
  string local_9c0;
  allocator<char> local_999;
  string local_998;
  allocator<char> local_971;
  string local_970;
  allocator<char> local_949;
  string local_948;
  allocator<char> local_921;
  string local_920;
  allocator<char> local_8f9;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  allocator<char> local_8a9;
  string local_8a8;
  allocator<char> local_881;
  string local_880;
  undefined1 local_860 [8];
  ParseResult arguments;
  string local_798;
  shared_ptr<cxxopts::Value> local_778;
  shared_ptr<const_cxxopts::Value> local_768;
  allocator<char> local_751;
  string local_750;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  shared_ptr<cxxopts::Value> local_6e0;
  shared_ptr<const_cxxopts::Value> local_6d0;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  shared_ptr<cxxopts::Value> local_648;
  shared_ptr<const_cxxopts::Value> local_638;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  shared_ptr<cxxopts::Value> local_5b0;
  shared_ptr<const_cxxopts::Value> local_5a0;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  shared_ptr<cxxopts::Value> local_518;
  shared_ptr<const_cxxopts::Value> local_508;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  shared_ptr<cxxopts::Value> local_480;
  shared_ptr<const_cxxopts::Value> local_470;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  shared_ptr<cxxopts::Value> local_3e8;
  shared_ptr<const_cxxopts::Value> local_3d8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  shared_ptr<cxxopts::Value> local_350;
  shared_ptr<const_cxxopts::Value> local_340;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  shared_ptr<cxxopts::Value> local_2b8;
  shared_ptr<const_cxxopts::Value> local_2a8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  OptionAdder local_220;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  undefined1 local_1a8 [8];
  Options options;
  uint32_t n_signals;
  allocator<char> local_71;
  string local_70 [8];
  string output_path;
  random_signal_generator rsg;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  rsg.pimpl = (impl *)argv;
  argv_local._0_4_ = argc;
  pcd::random_signal_generator::random_signal_generator
            ((random_signal_generator *)((long)&output_path.field_2 + 8),100,25.0,10.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"",&local_71);
  std::allocator<char>::~allocator(&local_71);
  options.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"random_signal_generator",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"A command line tool for generating random signals.",&local_1f1);
  cxxopts::Options::Options((Options *)local_1a8,&local_1c8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_241);
  cxxopts::Options::add_options(&local_220,(Options *)local_1a8,&local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"p,n_points",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"The length of the generated signal in data points. DEFAULT: 100",
             &local_291);
  cxxopts::value<unsigned_int>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_2a8,&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"",&local_2d9);
  pOVar1 = cxxopts::OptionAdder::operator()(&local_220,&local_268,&local_290,&local_2a8,&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"m,desired_mean",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,
             "The desired mean amplitude of the generated signal. DEFAULT: 25.0",&local_329);
  cxxopts::value<double>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_340,&local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"",&local_371);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_300,&local_328,&local_340,&local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"d,desired_standard_deviation",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,
             "The desired standard deviation in the amplitude of the generated signal. DEFAULT: 10.0"
             ,&local_3c1);
  cxxopts::value<double>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_3d8,&local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"",&local_409);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_398,&local_3c0,&local_3d8,&local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"b,n_bases",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,
             "The number of bases to use for generating the signal. DEFAULT: 50",&local_459);
  cxxopts::value<unsigned_char>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_470,&local_480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"",&local_4a1);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_430,&local_458,&local_470,&local_4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"f,max_frequency",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,
             "The maximum frequency of the generated signal over number of points specified. DEFAULT: 10.0"
             ,&local_4f1);
  cxxopts::value<double>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_508,&local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"",&local_539);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_4c8,&local_4f0,&local_508,&local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"n,noise_percentage",&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,
             "The amount of Gaussian noise to add as a percentage of the desired standard deviation. DEFAULT: 0.0"
             ,&local_589);
  cxxopts::value<double>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_5a0,&local_5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"",&local_5d1);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_560,&local_588,&local_5a0,&local_5d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"o,output_file",&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,
             "The desired CSV output file to write the signal to. If not specified, outputs to screen."
             ,&local_621);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_638,&local_648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"",&local_669);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_5f8,&local_620,&local_638,&local_668);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"s,n_signals",&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"The number of random signals to generate. DEFAULT: 1",&local_6b9)
  ;
  cxxopts::value<unsigned_int>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_6d0,&local_6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"",&local_701);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_690,&local_6b8,&local_6d0,&local_700);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"h,help",&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"Display help.",&local_751);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_768,&local_778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"",
             (allocator<char> *)
             ((long)&arguments.m_sequential.
                     super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cxxopts::OptionAdder::operator()(pOVar1,&local_728,&local_750,&local_768,&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&arguments.m_sequential.
                     super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_768);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_778);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator(&local_751);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_6d0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_6e0);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_638);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_648);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_5a0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_5b0);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_508);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_518);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_470);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_480);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_3d8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_340);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_350);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_2a8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_2b8);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  cxxopts::OptionAdder::~OptionAdder(&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  cxxopts::Options::parse
            ((ParseResult *)local_860,(Options *)local_1a8,(int *)&argv_local,(char ***)&rsg.pimpl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"p",&local_881);
  sVar2 = cxxopts::ParseResult::count((ParseResult *)local_860,&local_880);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a8,"p",&local_8a9);
    pOVar3 = cxxopts::ParseResult::operator[]((ParseResult *)local_860,&local_8a8);
    puVar4 = cxxopts::OptionValue::as<unsigned_int>(pOVar3);
    output_path.field_2._8_4_ = *puVar4;
    std::__cxx11::string::~string((string *)&local_8a8);
    std::allocator<char>::~allocator(&local_8a9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"m",&local_8d1);
  sVar2 = cxxopts::ParseResult::count((ParseResult *)local_860,&local_8d0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f8,"m",&local_8f9);
    pOVar3 = cxxopts::ParseResult::operator[]((ParseResult *)local_860,&local_8f8);
    pdVar5 = cxxopts::OptionValue::as<double>(pOVar3);
    rsg._0_8_ = *pdVar5;
    std::__cxx11::string::~string((string *)&local_8f8);
    std::allocator<char>::~allocator(&local_8f9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"d",&local_921);
  sVar2 = cxxopts::ParseResult::count((ParseResult *)local_860,&local_920);
  std::__cxx11::string::~string((string *)&local_920);
  std::allocator<char>::~allocator(&local_921);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"d",&local_949);
    pOVar3 = cxxopts::ParseResult::operator[]((ParseResult *)local_860,&local_948);
    pdVar5 = cxxopts::OptionValue::as<double>(pOVar3);
    rsg.desired_mean = *pdVar5;
    std::__cxx11::string::~string((string *)&local_948);
    std::allocator<char>::~allocator(&local_949);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_970,"b",&local_971);
  sVar2 = cxxopts::ParseResult::count((ParseResult *)local_860,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  std::allocator<char>::~allocator(&local_971);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"b",&local_999);
    pOVar3 = cxxopts::ParseResult::operator[]((ParseResult *)local_860,&local_998);
    puVar6 = cxxopts::OptionValue::as<unsigned_char>(pOVar3);
    rsg.desired_standard_deviation._0_1_ = *puVar6;
    std::__cxx11::string::~string((string *)&local_998);
    std::allocator<char>::~allocator(&local_999);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c0,"f",&local_9c1);
  sVar2 = cxxopts::ParseResult::count((ParseResult *)local_860,&local_9c0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::allocator<char>::~allocator(&local_9c1);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"f",&local_9e9);
    pOVar3 = cxxopts::ParseResult::operator[]((ParseResult *)local_860,&local_9e8);
    pdVar5 = cxxopts::OptionValue::as<double>(pOVar3);
    rsg._24_8_ = *pdVar5;
    std::__cxx11::string::~string((string *)&local_9e8);
    std::allocator<char>::~allocator(&local_9e9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a10,"n",&local_a11);
  sVar2 = cxxopts::ParseResult::count((ParseResult *)local_860,&local_a10);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator(&local_a11);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"n",&local_a39);
    pOVar3 = cxxopts::ParseResult::operator[]((ParseResult *)local_860,&local_a38);
    pdVar5 = cxxopts::OptionValue::as<double>(pOVar3);
    rsg.max_frequency = *pdVar5;
    std::__cxx11::string::~string((string *)&local_a38);
    std::allocator<char>::~allocator(&local_a39);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a60,"o",&local_a61);
  sVar2 = cxxopts::ParseResult::count((ParseResult *)local_860,&local_a60);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator(&local_a61);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a88,"o",&local_a89);
    pOVar3 = cxxopts::ParseResult::operator[]((ParseResult *)local_860,&local_a88);
    pbVar7 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
    std::__cxx11::string::operator=(local_70,(string *)pbVar7);
    std::__cxx11::string::~string((string *)&local_a88);
    std::allocator<char>::~allocator(&local_a89);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab0,"s",&local_ab1);
  sVar2 = cxxopts::ParseResult::count((ParseResult *)local_860,&local_ab0);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,"s",&local_ad9);
    pOVar3 = cxxopts::ParseResult::operator[]((ParseResult *)local_860,&local_ad8);
    puVar4 = cxxopts::OptionValue::as<unsigned_int>(pOVar3);
    options.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = *puVar4;
    std::__cxx11::string::~string((string *)&local_ad8);
    std::allocator<char>::~allocator(&local_ad9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b00,"h",&local_b01);
  sVar2 = cxxopts::ParseResult::count((ParseResult *)local_860,&local_b00);
  std::__cxx11::string::~string((string *)&local_b00);
  std::allocator<char>::~allocator(&local_b01);
  if (sVar2 != 0) {
    local_b48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b48);
    cxxopts::Options::help(&local_b28,(Options *)local_1a8,&local_b48);
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)&local_b28);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_b28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b48);
    argv_local._4_4_ = 0;
  }
  cxxopts::ParseResult::~ParseResult((ParseResult *)local_860);
  if (sVar2 == 0) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_b70);
    for (signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ <
        (uint)options.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count;
        signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Generating signal ");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1);
      poVar8 = std::operator<<(poVar8," of ");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(uint)options.m_help._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
      std::operator<<(poVar8,"...\r");
      std::ostream::flush();
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_b90);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_b70,(vector<double,_std::allocator<double>_> *)local_b90);
      signal_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)local_b70,
                               (ulong)signal.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pcd::random_signal_generator::generate
                ((random_signal_generator *)((long)&output_path.field_2 + 8),signal_00);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_b90);
    }
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"Done generating signals.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Writing to file \"");
      poVar8 = std::operator<<(poVar8,local_70);
      poVar8 = std::operator<<(poVar8,"\"...");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::ofstream::ofstream(&e_1);
      std::ofstream::open((string *)&e_1,(_Ios_Openmode)local_70);
      write_output((ostream *)&e_1,
                   (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_b70);
      std::ofstream::close();
      std::ofstream::~ofstream(&e_1);
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"Writing to console...");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      write_output((ostream *)&std::cout,
                   (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_b70);
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"Done.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_b70);
  }
  cxxopts::Options::~Options((Options *)local_1a8);
  std::__cxx11::string::~string(local_70);
  pcd::random_signal_generator::~random_signal_generator
            ((random_signal_generator *)((long)&output_path.field_2 + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    // Set up random_signal_generator with default parameters.
    pcd::random_signal_generator rsg(100, 25.0, 10.0);

    // Set up default output file string.
    std::string output_path = "";

    // Set up default n_signals.
    uint32_t n_signals = 1;

    // Parse user arguments.
    // Set up options.
    cxxopts::Options options("random_signal_generator", "A command line tool for generating random signals.");
    options.add_options()
        ("p,n_points", "The length of the generated signal in data points. DEFAULT: 100", cxxopts::value<uint32_t>())
        ("m,desired_mean", "The desired mean amplitude of the generated signal. DEFAULT: 25.0", cxxopts::value<double>())
        ("d,desired_standard_deviation", "The desired standard deviation in the amplitude of the generated signal. DEFAULT: 10.0", cxxopts::value<double>())
        ("b,n_bases", "The number of bases to use for generating the signal. DEFAULT: 50", cxxopts::value<uint8_t>())
        ("f,max_frequency", "The maximum frequency of the generated signal over number of points specified. DEFAULT: 10.0", cxxopts::value<double>())
        ("n,noise_percentage", "The amount of Gaussian noise to add as a percentage of the desired standard deviation. DEFAULT: 0.0", cxxopts::value<double>())
        ("o,output_file", "The desired CSV output file to write the signal to. If not specified, outputs to screen.", cxxopts::value<std::string>())
        ("s,n_signals", "The number of random signals to generate. DEFAULT: 1", cxxopts::value<uint32_t>())
        ("h,help", "Display help.");
    try
    {
        // Parse options.
        auto arguments = options.parse(argc, argv);
        // Update parameters if provided.
        if(arguments.count("p"))
        {
            rsg.n_points = arguments["p"].as<uint32_t>();
        }
        if(arguments.count("m"))
        {
            rsg.desired_mean = arguments["m"].as<double>();
        }
        if(arguments.count("d"))
        {
            rsg.desired_standard_deviation = arguments["d"].as<double>();
        }
        if(arguments.count("b"))
        {
            rsg.n_bases = arguments["b"].as<uint8_t>();
        }
        if(arguments.count("f"))
        {
            rsg.max_frequency = arguments["f"].as<double>();
        }
        if(arguments.count("n"))
        {
            rsg.noise_percentage = arguments["n"].as<double>();
        }
        if(arguments.count("o"))
        {
            output_path = arguments["o"].as<std::string>();
        }
        if(arguments.count("s"))
        {
            n_signals = arguments["s"].as<uint32_t>();
        }
        if(arguments.count("h"))
        {
            std::cout << options.help() << std::endl;
            return 0;
        }
    }
    catch(const cxxopts::OptionParseException& e)
    {
        std::cerr << e.what() << std::endl;
        return 1;
    }

    // Create vectors for storing signals.
    std::vector<std::vector<double>> signals;

    // Run the generator.
    for(uint32_t i = 0; i < n_signals; i++)
    {
        std::cout << "Generating signal " << i + 1 << " of " << n_signals << "...\r";
        std::cout.flush();

        std::vector<double> signal;
        signals.push_back(signal);
        rsg.generate(signals[i]);
    }
    std::cout << std::endl << "Done generating signals." << std::endl;

    // Write output.
    if(!output_path.empty())
    {
        std::cout << "Writing to file \"" << output_path << "\"..." << std::endl;
        try
        {
            std::ofstream output_file;
            output_file.open(output_path, std::ios::out);
            write_output(output_file, signals);
            output_file.close();
        }
        catch(const std::exception& e)
        {
            std::cerr << e.what() << std::endl;
            return 2;
        }
    }
    else
    {
        std::cout << "Writing to console..." << std::endl;
        write_output(std::cout, signals);
    }

    std::cout << "Done." << std::endl;

    return 0;
}